

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O0

int Fl_Text_Editor::kf_backspace(int param_1,Fl_Text_Editor *e)

{
  int iVar1;
  uint uVar2;
  Fl_When FVar3;
  Fl_Text_Buffer *pFVar4;
  fd_set *in_RCX;
  fd_set *in_R8;
  timeval *in_R9;
  int p2;
  int p1;
  Fl_Text_Editor *e_local;
  int param_0_local;
  
  pFVar4 = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
  iVar1 = Fl_Text_Buffer::selected(pFVar4);
  if (iVar1 == 0) {
    iVar1 = Fl_Text_Display::move_left(&e->super_Fl_Text_Display);
    if (iVar1 != 0) {
      iVar1 = Fl_Text_Display::insert_position(&e->super_Fl_Text_Display);
      pFVar4 = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
      uVar2 = Fl_Text_Buffer::next_char(pFVar4,iVar1);
      pFVar4 = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
      Fl_Text_Buffer::select(pFVar4,iVar1,(fd_set *)(ulong)uVar2,in_RCX,in_R8,in_R9);
    }
  }
  kill_selection(e);
  Fl_Text_Display::show_insert_position(&e->super_Fl_Text_Display);
  Fl_Widget::set_changed((Fl_Widget *)e);
  FVar3 = Fl_Widget::when((Fl_Widget *)e);
  if ((FVar3 & FL_WHEN_CHANGED) != FL_WHEN_NEVER) {
    Fl_Widget::do_callback((Fl_Widget *)e);
  }
  return 1;
}

Assistant:

int Fl_Text_Editor::kf_backspace(int, Fl_Text_Editor* e) {
  if (!e->buffer()->selected() && e->move_left()) {
    int p1 = e->insert_position();
    int p2 = e->buffer()->next_char(p1);
    e->buffer()->select(p1, p2);
  }
  kill_selection(e);
  e->show_insert_position();
  e->set_changed();
  if (e->when()&FL_WHEN_CHANGED) e->do_callback();
  return 1;
}